

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_opc(TCGContext_conflict9 *s,int opc,int r,int rm,int x)

{
  tcg_insn_unit *ptVar1;
  byte *pbVar2;
  tcg_insn_unit tVar3;
  uint uVar4;
  
  if ((short)opc < 0) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 'e';
  }
  if (((uint)opc >> 10 & 1) != 0) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 'f';
  }
  if (((uint)opc >> 0x11 & 1) != 0) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xf3;
  }
  uVar4 = (uint)rm >> 3 & 1 | (uint)r >> 1 & 4 | (uint)opc >> 9 & 8 | (uint)x >> 2 & 2;
  if ((((uint)(3 < rm) << 0xe | (uint)(3 < r) << 0xd) & opc) != 0 || uVar4 != 0) {
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = (byte)uVar4 | 0x40;
  }
  if ((opc & 0x10300U) != 0) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '\x0f';
    tVar3 = '8';
    if ((((uint)opc >> 9 & 1) != 0) || (tVar3 = ':', ((uint)opc >> 0x10 & 1) != 0)) {
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = tVar3;
    }
  }
  ptVar1 = s->code_ptr;
  s->code_ptr = ptVar1 + 1;
  *ptVar1 = (tcg_insn_unit)opc;
  return;
}

Assistant:

static void tcg_out_opc(TCGContext *s, int opc, int r, int rm, int x)
{
    int rex;

    if (opc & P_GS) {
        tcg_out8(s, 0x65);
    }
    if (opc & P_DATA16) {
        /* We should never be asking for both 16 and 64-bit operation.  */
        tcg_debug_assert((opc & P_REXW) == 0);
        tcg_out8(s, 0x66);
    }
    if (opc & P_SIMDF3) {
        tcg_out8(s, 0xf3);
    } else if (opc & P_SIMDF2) {
        tcg_out8(s, 0xf2);
    }

    rex = 0;
    rex |= (opc & P_REXW) ? 0x8 : 0x0;  /* REX.W */
    rex |= (r & 8) >> 1;                /* REX.R */
    rex |= (x & 8) >> 2;                /* REX.X */
    rex |= (rm & 8) >> 3;               /* REX.B */

    /* P_REXB_{R,RM} indicates that the given register is the low byte.
       For %[abcd]l we need no REX prefix, but for %{si,di,bp,sp}l we do,
       as otherwise the encoding indicates %[abcd]h.  Note that the values
       that are ORed in merely indicate that the REX byte must be present;
       those bits get discarded in output.  */
    rex |= opc & (r >= 4 ? P_REXB_R : 0);
    rex |= opc & (rm >= 4 ? P_REXB_RM : 0);

    if (rex) {
        tcg_out8(s, (uint8_t)(rex | 0x40));
    }

    if (opc & (P_EXT | P_EXT38 | P_EXT3A)) {
        tcg_out8(s, 0x0f);
        if (opc & P_EXT38) {
            tcg_out8(s, 0x38);
        } else if (opc & P_EXT3A) {
            tcg_out8(s, 0x3a);
        }
    }

    tcg_out8(s, opc);
}